

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O2

MethodPrototypeSymbol *
slang::ast::MethodPrototypeSymbol::fromSyntax(Scope *scope,ClassMethodPrototypeSyntax *syntax)

{
  undefined1 *puVar1;
  FunctionPrototypeSyntax *proto;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  Scope *this;
  bitmask<slang::ast::MethodFlags> bVar2;
  int iVar3;
  pair<slang::bitmask<slang::ast::MethodFlags>,_slang::ast::Visibility> pVar4;
  MethodPrototypeSymbol *this_00;
  undefined4 extraout_var;
  FunctionPortListSyntax *extraout_RDX;
  FunctionPortListSyntax *syntax_01;
  size_t extraout_RDX_00;
  Compilation *args;
  SourceRange sourceRange;
  SubroutineKind subroutineKind;
  Token nameToken;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> arguments;
  pair<slang::bitmask<slang::ast::MethodFlags>,_slang::ast::Visibility> local_a0;
  SubroutineKind local_94;
  Scope *local_90;
  Token local_88;
  SourceLocation local_78;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> local_70 [2];
  
  args = scope->compilation;
  proto = (syntax->prototype).ptr;
  local_90 = scope;
  pVar4 = getMethodFlags(&syntax->qualifiers,proto);
  local_94 = (SubroutineKind)((proto->keyword).kind == TaskKeyword);
  local_a0 = pVar4;
  local_88 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)(proto->name).ptr);
  if (local_88.kind == NewKeyword) {
    local_a0 = (pair<slang::bitmask<slang::ast::MethodFlags>,_slang::ast::Visibility>)
               (CONCAT62(local_a0._2_6_,pVar4.first.m_bits.m_bits) | 8);
  }
  local_70[0]._0_16_ = (undefined1  [16])parsing::Token::valueText(&local_88);
  local_78 = parsing::Token::location(&local_88);
  this_00 = BumpAllocator::
            emplace<slang::ast::MethodPrototypeSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::SubroutineKind&,slang::ast::Visibility&,slang::bitmask<slang::ast::MethodFlags>&>
                      (&args->super_BumpAllocator,args,
                       (basic_string_view<char,_std::char_traits<char>_> *)local_70,&local_78,
                       &local_94,&local_a0.second,&local_a0.first);
  this = local_90;
  (this_00->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_00._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&this_00->super_Symbol,local_90,syntax_00);
  if (((ulong)local_a0 & 8) == 0 && local_94 == Function) {
    (this_00->declaredReturnType).typeOrLink =
         (anon_union_8_2_f12d5f64_for_typeOrLink)(proto->returnType).ptr;
    puVar1 = &(this_00->declaredReturnType).field_0x3f;
    *puVar1 = *puVar1 & 0x7f;
  }
  else {
    (this_00->declaredReturnType).type = args->voidType;
  }
  if (((((ulong)local_a0 & 2) != 0) && (*(char *)&this->thisSym[2].name._M_str == '\0')) &&
     (*(char *)((long)&this->thisSym[2].name._M_str + 1) == '\0')) {
    sourceRange = parsing::Token::range(&local_88);
    Scope::addDiag(this,(DiagCode)0xb30006,sourceRange);
    local_a0 = (pair<slang::bitmask<slang::ast::MethodFlags>,_slang::ast::Visibility>)
               ((ulong)local_a0 & 0xfffffffffffffffd);
  }
  local_70[0].len = 0;
  local_70[0].data_ = (pointer)((long)local_70 + 0x18);
  local_70[0].cap = 5;
  syntax_01 = proto->portList;
  if (syntax_01 != (FunctionPortListSyntax *)0x0) {
    bVar2 = SubroutineSymbol::buildArguments
                      (&this_00->super_Scope,this,syntax_01,Automatic,local_70);
    (this_00->flags).m_bits = (this_00->flags).m_bits | bVar2.m_bits;
    syntax_01 = extraout_RDX;
  }
  iVar3 = SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::copy
                    (local_70,(EVP_PKEY_CTX *)args,(EVP_PKEY_CTX *)syntax_01);
  (this_00->arguments)._M_ptr = (pointer)CONCAT44(extraout_var,iVar3);
  (this_00->arguments)._M_extent._M_extent_value = extraout_RDX_00;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::cleanup(local_70,(EVP_PKEY_CTX *)args);
  return this_00;
}

Assistant:

MethodPrototypeSymbol& MethodPrototypeSymbol::fromSyntax(const Scope& scope,
                                                         const ClassMethodPrototypeSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto& proto = *syntax.prototype;
    auto [flags, visibility] = getMethodFlags(syntax.qualifiers, proto);
    auto subroutineKind = proto.keyword.kind == TokenKind::TaskKeyword ? SubroutineKind::Task
                                                                       : SubroutineKind::Function;

    Token nameToken = proto.name->getLastToken();
    if (nameToken.kind == TokenKind::NewKeyword)
        flags |= MethodFlags::Constructor;

    auto result = comp.emplace<MethodPrototypeSymbol>(comp, nameToken.valueText(),
                                                      nameToken.location(), subroutineKind,
                                                      visibility, flags);
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    if (subroutineKind == SubroutineKind::Function && !flags.has(MethodFlags::Constructor))
        result->declaredReturnType.setTypeSyntax(*proto.returnType);
    else
        result->declaredReturnType.setType(comp.getVoidType());

    // Pure virtual methods can only appear in virtual or interface classes.
    if (flags.has(MethodFlags::Pure)) {
        auto& classType = scope.asSymbol().as<ClassType>();
        if (!classType.isAbstract && !classType.isInterface) {
            scope.addDiag(diag::PureInAbstract, nameToken.range());
            flags &= ~MethodFlags::Pure;
        }
    }

    SmallVector<const FormalArgumentSymbol*> arguments;
    if (proto.portList) {
        result->flags |= SubroutineSymbol::buildArguments(*result, scope, *proto.portList,
                                                          VariableLifetime::Automatic, arguments);
    }

    result->arguments = arguments.copy(comp);
    return *result;
}